

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Own<const_kj::File,_std::nullptr_t> __thiscall
kj::anon_unknown_9::DiskDirectory::createTemporary(DiskDirectory *this)

{
  PathPtr finalName;
  int iVar1;
  long lVar2;
  File *extraout_RDX;
  File *extraout_RDX_00;
  File *pFVar3;
  long in_RSI;
  char *__name;
  DiskHandle *this_00;
  StringPtr name;
  Own<const_kj::File,_std::nullptr_t> OVar4;
  int newFd_;
  OwnFd local_80;
  OwnFd local_7c;
  Own<kj::File,_std::nullptr_t> result;
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t> local_58;
  String temp;
  Fault local_28;
  
  this_00 = (DiskHandle *)(in_RSI + 8);
  do {
    lVar2 = syscall(0x101,(ulong)(uint)(this_00->fd).fd,".",0x410002,0x1c0);
    newFd_ = (int)lVar2;
    if (-1 < newFd_) goto LAB_001dc8ac;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (1 < iVar1 - 0x15U) {
    if (iVar1 == 0) {
LAB_001dc8ac:
      local_58.disposer = (Disposer *)CONCAT44(local_58.disposer._4_4_,newFd_);
      result.disposer._0_4_ = 0xffffffff;
      newDiskFile((kj *)&temp,(OwnFd *)&local_58);
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
           (_func_int **)temp.content.ptr;
      *(size_t *)&this->super_DiskHandle = temp.content.size_;
      temp.content.size_ = 0;
      Own<kj::File,_std::nullptr_t>::dispose((Own<kj::File,_std::nullptr_t> *)&temp);
      OwnFd::~OwnFd((OwnFd *)&local_58);
      OwnFd::~OwnFd((OwnFd *)&result);
      pFVar3 = extraout_RDX;
      goto LAB_001dca5b;
    }
    if (iVar1 != 0x5f) {
      kj::_::Debug::Fault::Fault
                ((Fault *)&temp,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                 ,0x549,iVar1,"open(O_TMPFILE)","");
      kj::_::Debug::Fault::~Fault((Fault *)&temp);
    }
  }
  name.content.size_ = 8;
  name.content.ptr = "unnamed";
  Path::Path((Path *)&result,name);
  finalName.parts.ptr._4_4_ = result.disposer._4_4_;
  finalName.parts.ptr._0_4_ = result.disposer._0_4_;
  finalName.parts.size_ = (size_t)result.ptr;
  local_58.ptr = (Iface *)operator_new(0x18);
  (local_58.ptr)->_vptr_Iface = (_func_int **)&PTR_operator___00279af0;
  local_58.ptr[1]._vptr_Iface = (_func_int **)&newFd_;
  local_58.ptr[2]._vptr_Iface = (_func_int **)this_00;
  local_58.disposer =
       (Disposer *)
       &kj::_::
        HeapDisposer<kj::Function<int(kj::StringPtr)>::Impl<kj::(anonymous_namespace)::DiskHandle::createTemporary()const::{lambda(kj::StringPtr)#1}>>
        ::instance;
  DiskHandle::createNamedTemporary
            (&temp,this_00,finalName,CREATE,(Function<int_(kj::StringPtr)> *)&local_58);
  Own<kj::Function<int_(kj::StringPtr)>::Iface,_std::nullptr_t>::dispose(&local_58);
  Array<kj::String>::~Array((Array<kj::String> *)&result);
  local_80.fd = newFd_;
  local_7c.fd = -1;
  newDiskFile((kj *)&result,&local_80);
  OwnFd::~OwnFd(&local_80);
  do {
    __name = "";
    if (temp.content.size_ != 0) {
      __name = temp.content.ptr;
    }
    iVar1 = unlinkat((this_00->fd).fd,__name,0);
    if (-1 < iVar1) goto LAB_001dca32;
    iVar1 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 != 0) {
    kj::_::Debug::Fault::Fault
              (&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x55d,iVar1,"unlinkat(fd, temp.cStr(), 0)","");
    kj::_::Debug::Fault::~Fault(&local_28);
  }
LAB_001dca32:
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)CONCAT44(result.disposer._4_4_,result.disposer._0_4_);
  *(File **)&this->super_DiskHandle = result.ptr;
  result.ptr = (File *)0x0;
  Own<kj::File,_std::nullptr_t>::dispose(&result);
  OwnFd::~OwnFd(&local_7c);
  Array<char>::~Array(&temp.content);
  pFVar3 = extraout_RDX_00;
LAB_001dca5b:
  OVar4.ptr = pFVar3;
  OVar4.disposer = (Disposer *)this;
  return OVar4;
}

Assistant:

Own<const File> createTemporary() const override {
    return DiskHandle::createTemporary();
  }